

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

TimingCheckArgSyntax * __thiscall slang::parsing::Parser::parseTimingCheckArg(Parser *this)

{
  Token placeholder;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token closeBracket_00;
  SourceRange range_00;
  Token openBracket_00;
  Token edge_00;
  Token edge_01;
  SourceRange range_01;
  SourceRange range_02;
  string_view arg;
  bool bVar1;
  size_type sVar2;
  TimingCheckEventConditionSyntax *pTVar3;
  Info *pIVar4;
  size_t in_RDI;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *in_stack_00000030;
  Token *in_stack_00000038;
  TokenKind in_stack_00000042;
  TokenKind in_stack_00000044;
  TokenKind in_stack_00000046;
  ParserBase *in_stack_00000048;
  Token *in_stack_00000060;
  TimingCheckEventConditionSyntax *cond;
  DiagCode in_stack_00000070;
  ExpressionSyntax *expr;
  AllowEmpty in_stack_00000080;
  TimingCheckEventConditionSyntax *cond_1;
  NameSyntax *terminal;
  SourceRange range;
  element_type *lastDesc;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> list;
  Token closeBracket;
  Token openBracket;
  EdgeControlSpecifierSyntax *control;
  Token edge;
  anon_class_8_1_8991fb9c parseCondition;
  SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined2 in_stack_fffffffffffffe0c;
  TokenKind in_stack_fffffffffffffe0e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  SourceLocation in_stack_fffffffffffffe20;
  SourceLocation in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  DiagCode code;
  Diagnostic *in_stack_fffffffffffffe40;
  ParserBase *in_stack_fffffffffffffe50;
  bitmask<slang::parsing::detail::ExpressionOptions> local_194;
  Parser *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  bitmask<slang::parsing::detail::ExpressionOptions> options;
  undefined1 local_88 [12];
  undefined4 local_7c;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> local_78;
  SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> local_68;
  Token local_28;
  TimingCheckEventArgSyntax *local_10;
  
  code = SUB84((ulong)in_stack_fffffffffffffe30 >> 0x20,0);
  options.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe10._M_extent_value,
                           in_stack_fffffffffffffe0e);
  if ((bVar1) ||
     (bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe10._M_extent_value,
                               in_stack_fffffffffffffe0e), bVar1)) {
    local_28 = ParserBase::placeholderToken(in_stack_fffffffffffffe50);
    placeholder.info._0_4_ = in_stack_fffffffffffffe00;
    placeholder._0_8_ = in_stack_fffffffffffffdf8;
    placeholder.info._4_4_ = in_stack_fffffffffffffe04;
    local_10 = (TimingCheckEventArgSyntax *)
               slang::syntax::SyntaxFactory::emptyTimingCheckArg
                         ((SyntaxFactory *)0xa59122,placeholder);
  }
  else {
    local_68.elements =
         (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>)
         parseEdgeKeyword((Parser *)in_stack_fffffffffffffe10._M_extent_value);
    bVar1 = Token::operator_cast_to_bool((Token *)0xa5915e);
    if (bVar1) {
      local_68.super_SyntaxListBase.childCount = 0;
      bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe10._M_extent_value,
                               in_stack_fffffffffffffe0e);
      if (bVar1) {
        Token::Token((Token *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        Token::Token((Token *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::span
                  ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0xa591b2);
        local_7c = 0x3a0005;
        in_stack_fffffffffffffdf8 = &local_68;
        in_stack_fffffffffffffe10._M_extent_value = (size_t)local_88;
        in_stack_fffffffffffffe00 = 1;
        in_stack_fffffffffffffe08 = 0x3a0005;
        in_stack_fffffffffffffe18 = 0;
        ParserBase::
        parseList<&slang::syntax::SyntaxFacts::isPossibleEdgeDescriptor,&slang::syntax::SyntaxFacts::isEndOfBracketedList,slang::parsing::Parser::parseTimingCheckArg()::__0>
                  (in_stack_00000048,in_stack_00000046,in_stack_00000044,in_stack_00000042,
                   in_stack_00000038,in_stack_00000030,in_stack_00000060,(RequireItems)cond,
                   in_stack_00000070,(anon_class_8_1_8991fb9c *)expr,in_stack_00000080);
        elements._M_ptr._4_2_ = in_stack_fffffffffffffe0c;
        elements._M_ptr._0_4_ = in_stack_fffffffffffffe08;
        elements._M_ptr._6_2_ = in_stack_fffffffffffffe0e;
        elements._M_extent._M_extent_value = in_stack_fffffffffffffe10._M_extent_value;
        slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::SeparatedSyntaxList
                  ((SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *)
                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),elements);
        openBracket_00.rawLen = in_stack_fffffffffffffe1c;
        openBracket_00.kind = (short)in_stack_fffffffffffffe18;
        openBracket_00._2_1_ = (char)((uint)in_stack_fffffffffffffe18 >> 0x10);
        openBracket_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffe18 >> 0x18);
        openBracket_00.info = (Info *)in_stack_fffffffffffffe20;
        closeBracket_00.rawLen._0_2_ = in_stack_fffffffffffffe0c;
        closeBracket_00.kind = (short)in_stack_fffffffffffffe08;
        closeBracket_00._2_1_ = (char)((uint)in_stack_fffffffffffffe08 >> 0x10);
        closeBracket_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffe08 >> 0x18);
        closeBracket_00.rawLen._2_2_ = in_stack_fffffffffffffe0e;
        closeBracket_00.info = (Info *)in_stack_fffffffffffffe10._M_extent_value;
        local_68.super_SyntaxListBase.childCount =
             (size_t)slang::syntax::SyntaxFactory::edgeControlSpecifier
                               ((SyntaxFactory *)
                                CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                openBracket_00,in_stack_fffffffffffffdf8,closeBracket_00);
        sVar2 = std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::size
                          ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0xa592fc);
        if (0xb < sVar2) {
          std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::operator[](&local_78,0xb)
          ;
          bVar1 = slang::syntax::ConstTokenOrSyntax::isNode((ConstTokenOrSyntax *)0xa5932d);
          if (bVar1) {
            slang::syntax::TokenOrSyntax::node((TokenOrSyntax *)0xa59340);
            slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffe50);
          }
          else {
            slang::syntax::ConstTokenOrSyntax::token
                      ((ConstTokenOrSyntax *)in_stack_fffffffffffffdf8);
            Token::range((Token *)in_stack_fffffffffffffe20);
          }
          range_01.endLoc = in_stack_fffffffffffffe28;
          range_01.startLoc = in_stack_fffffffffffffe20;
          ParserBase::addDiag((ParserBase *)
                              CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),code,
                              range_01);
        }
        if ((TokenKind)local_68.elements._M_ptr != EdgeKeyword) {
          Token::range((Token *)in_stack_fffffffffffffe20);
          range_02.endLoc = in_stack_fffffffffffffe28;
          range_02.startLoc = in_stack_fffffffffffffe20;
          in_stack_fffffffffffffe28 =
               (SourceLocation)
               ParserBase::addDiag((ParserBase *)
                                   CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                                   code,range_02);
          Token::valueText((Token *)in_stack_fffffffffffffe10._M_extent_value);
          arg._M_str = (char *)in_stack_fffffffffffffe50;
          arg._M_len = in_RDI;
          Diagnostic::operator<<(in_stack_fffffffffffffe40,arg);
          slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffe50);
          range_00.startLoc._4_2_ = in_stack_fffffffffffffe0c;
          range_00.startLoc._0_4_ = in_stack_fffffffffffffe08;
          range_00.startLoc._6_2_ = in_stack_fffffffffffffe0e;
          range_00.endLoc = (SourceLocation)in_stack_fffffffffffffe10._M_extent_value;
          Diagnostic::operator<<
                    ((Diagnostic *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     range_00);
        }
      }
      parseName((Parser *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      parseTimingCheckArg::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffe28);
      edge_00.rawLen = in_stack_fffffffffffffe1c;
      edge_00.kind = (short)in_stack_fffffffffffffe18;
      edge_00._2_1_ = (char)((uint)in_stack_fffffffffffffe18 >> 0x10);
      edge_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffe18 >> 0x18);
      edge_00.info = (Info *)in_stack_fffffffffffffe20;
      local_10 = slang::syntax::SyntaxFactory::timingCheckEventArg
                           ((SyntaxFactory *)in_stack_fffffffffffffe10._M_extent_value,edge_00,
                            (EdgeControlSpecifierSyntax *)
                            CONCAT26(in_stack_fffffffffffffe0e,
                                     CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)),
                            (ExpressionSyntax *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                            (TimingCheckEventConditionSyntax *)in_stack_fffffffffffffdf8);
    }
    else {
      memset(&local_194,0,4);
      bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_194);
      parseMinTypMaxExpression(in_stack_fffffffffffffe70,options);
      pTVar3 = parseTimingCheckArg::anon_class_8_1_8991fb9c::operator()
                         ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffe28);
      if (pTVar3 == (TimingCheckEventConditionSyntax *)0x0) {
        local_10 = (TimingCheckEventArgSyntax *)
                   slang::syntax::SyntaxFactory::expressionTimingCheckArg
                             ((SyntaxFactory *)
                              CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                              (ExpressionSyntax *)in_stack_fffffffffffffdf8);
      }
      else {
        pIVar4 = (Info *)(in_RDI + 0xe0);
        Token::Token((Token *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        edge_01.rawLen = in_stack_fffffffffffffe1c;
        edge_01.kind = (short)in_stack_fffffffffffffe18;
        edge_01._2_1_ = (char)((uint)in_stack_fffffffffffffe18 >> 0x10);
        edge_01.numFlags.raw = (char)((uint)in_stack_fffffffffffffe18 >> 0x18);
        edge_01.info = pIVar4;
        local_10 = slang::syntax::SyntaxFactory::timingCheckEventArg
                             ((SyntaxFactory *)in_stack_fffffffffffffe10._M_extent_value,edge_01,
                              (EdgeControlSpecifierSyntax *)
                              CONCAT26(in_stack_fffffffffffffe0e,
                                       CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                                      ),
                              (ExpressionSyntax *)
                              CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                              (TimingCheckEventConditionSyntax *)in_stack_fffffffffffffdf8);
      }
    }
  }
  return &local_10->super_TimingCheckArgSyntax;
}

Assistant:

TimingCheckArgSyntax& Parser::parseTimingCheckArg() {
    if (peek(TokenKind::Comma) || peek(TokenKind::CloseParenthesis))
        return factory.emptyTimingCheckArg(placeholderToken());

    auto parseCondition = [&]() -> TimingCheckEventConditionSyntax* {
        if (!peek(TokenKind::TripleAnd))
            return nullptr;

        // The syntax in the BNF for condition expressions is nonsensical,
        // and there is some discussion in the Mantis tracker about how it's
        // a holdover from Verilog-XL and should likely be replaced with just
        // a plain old expression, so that's what we're doing here.
        auto tripleAnd = consume();
        auto& expr = parseExpression();
        return &factory.timingCheckEventCondition(tripleAnd, expr);
    };

    auto edge = parseEdgeKeyword();
    if (edge) {
        EdgeControlSpecifierSyntax* control = nullptr;
        if (peek(TokenKind::OpenBracket)) {
            Token openBracket, closeBracket;
            std::span<TokenOrSyntax> list;
            parseList<isPossibleEdgeDescriptor, isEndOfBracketedList>(
                TokenKind::OpenBracket, TokenKind::CloseBracket, TokenKind::Comma, openBracket,
                list, closeBracket, RequireItems::True, diag::ExpectedEdgeDescriptor,
                [this] { return &parseEdgeDescriptor(); });

            control = &factory.edgeControlSpecifier(openBracket, list, closeBracket);

            // List is allowed to have up to 6 specifiers (plus 5 commas)
            if (list.size() > 11) {
                auto& lastDesc = list[11];
                auto range = lastDesc.isNode() ? lastDesc.node()->sourceRange()
                                               : lastDesc.token().range();
                addDiag(diag::TooManyEdgeDescriptors, range);
            }

            if (edge.kind != TokenKind::EdgeKeyword) {
                addDiag(diag::EdgeDescWrongKeyword, edge.range())
                    << edge.valueText() << control->sourceRange();
            }
        }

        auto& terminal = parseName();
        auto cond = parseCondition();
        return factory.timingCheckEventArg(edge, control, terminal, cond);
    }

    auto& expr = parseMinTypMaxExpression();
    auto cond = parseCondition();
    if (cond)
        return factory.timingCheckEventArg(Token(), nullptr, expr, cond);

    else
        return factory.expressionTimingCheckArg(expr);
}